

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptObject.cpp
# Opt level: O1

Var Js::JavascriptObject::EntrySetPrototypeOf(RecyclableObject *function,CallInfo callInfo,...)

{
  ScriptContext *pSVar1;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  undefined4 *puVar5;
  Var pvVar6;
  RecyclableObject *object;
  JavascriptCopyOnAccessNativeIntArray *this;
  RecyclableObject *newPrototype;
  int32 hCode;
  int in_stack_00000010;
  CallInfo local_38;
  CallInfo callInfo_local;
  ArgumentReader args;
  
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  local_38 = callInfo;
  ThreadContext::ProbeStack(pSVar1->threadContext,0xc00,pSVar1,(PVOID)0x0);
  if (in_stack_00000010 != local_38._0_4_) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptObject.cpp"
                                ,0x32d,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar3) goto LAB_00cf1285;
    *puVar5 = 0;
  }
  callInfo_local = local_38;
  ArgumentReader::AdjustArguments((ArgumentReader *)&callInfo_local,&local_38);
  if (((ulong)local_38 & 0x1000000) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptObject.cpp"
                                ,0x32e,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar3) {
LAB_00cf1285:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  hCode = -0x7ff5ec36;
  if (((ulong)callInfo_local & 0xfffffe) != 0) {
    pvVar6 = Arguments::operator[]((Arguments *)&callInfo_local,1);
    BVar4 = JavascriptConversion::CheckObjectCoercible(pvVar6,pSVar1);
    if (BVar4 != 0) {
      if (2 < (callInfo_local._0_4_ & 0xffffff)) {
        pvVar6 = Arguments::operator[]((Arguments *)&callInfo_local,2);
        BVar4 = JavascriptOperators::IsObjectOrNull(pvVar6);
        if (BVar4 != 0) {
          hCode = 0;
          bVar3 = true;
          goto LAB_00cf11d0;
        }
      }
      hCode = -0x7ff5ec31;
    }
  }
  bVar3 = false;
LAB_00cf11d0:
  if (bVar3) {
    pvVar6 = Arguments::operator[]((Arguments *)&callInfo_local,1);
    BVar4 = JavascriptOperators::IsObject(pvVar6);
    object = (RecyclableObject *)Arguments::operator[]((Arguments *)&callInfo_local,1);
    if (BVar4 != 0) {
      if (object != (RecyclableObject *)0x0) {
        bVar3 = VarIs<Js::JavascriptCopyOnAccessNativeIntArray>(object);
        if (bVar3) {
          this = UnsafeVarTo<Js::JavascriptCopyOnAccessNativeIntArray>(object);
        }
        else {
          this = (JavascriptCopyOnAccessNativeIntArray *)0x0;
        }
        if (this != (JavascriptCopyOnAccessNativeIntArray *)0x0) {
          JavascriptCopyOnAccessNativeIntArray::ConvertCopyOnAccessSegment(this);
        }
      }
      pvVar6 = Arguments::operator[]((Arguments *)&callInfo_local,1);
      object = VarTo<Js::RecyclableObject>(pvVar6);
      pvVar6 = Arguments::operator[]((Arguments *)&callInfo_local,2);
      newPrototype = VarTo<Js::RecyclableObject>(pvVar6);
      ChangePrototype(object,newPrototype,true,pSVar1);
    }
    return object;
  }
  JavascriptError::ThrowTypeError(pSVar1,hCode,L"Object.setPrototypeOf");
}

Assistant:

Var JavascriptObject::EntrySetPrototypeOf(RecyclableObject* function, CallInfo callInfo, ...)
{
    PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

    ARGUMENTS(args, callInfo);
    Assert(!(callInfo.Flags & CallFlags_New));
    ScriptContext* scriptContext = function->GetScriptContext();

    // 19.1.2.18
    // Object.setPrototypeOf ( O, proto )
    // When the setPrototypeOf function is called with arguments O and proto, the following steps are taken:
    // 1. Let O be RequireObjectCoercible(O).
    // 2. ReturnIfAbrupt(O).
    // 3. If Type(proto) is neither Object or Null, then throw a TypeError exception.
    int32 errCode = NOERROR;

    if (args.Info.Count < 2 || !JavascriptConversion::CheckObjectCoercible(args[1], scriptContext))
    {
        errCode = JSERR_FunctionArgument_NeedObject;
    }
    else if (args.Info.Count < 3 || !JavascriptOperators::IsObjectOrNull(args[2]))
    {
        errCode = JSERR_FunctionArgument_NotObjectOrNull;
    }

    if (errCode != NOERROR)
    {
        JavascriptError::ThrowTypeError(scriptContext, errCode, _u("Object.setPrototypeOf"));
    }

    // 4. If Type(O) is not Object, return O.
    if (!JavascriptOperators::IsObject(args[1]))
    {
        return args[1];
    }

#if ENABLE_COPYONACCESS_ARRAY
    JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<Var>(args[1]);
#endif
    RecyclableObject* object = VarTo<RecyclableObject>(args[1]);
    RecyclableObject* newPrototype = VarTo<RecyclableObject>(args[2]);

    // 5. Let status be O.[[SetPrototypeOf]](proto).
    // 6. ReturnIfAbrupt(status).
    // 7. If status is false, throw a TypeError exception.
    ChangePrototype(object, newPrototype, /*shouldThrow*/true, scriptContext);

    // 8. Return O.
    return object;
}